

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O0

int check_long_utf16(void)

{
  int iVar1;
  uchar *input;
  uchar *buffer;
  uchar ch1;
  int iStack_1f0;
  uchar ch0;
  int failed;
  int j;
  int k;
  yaml_parser_t parser;
  
  buffer._4_4_ = 0;
  input = (uchar *)malloc(0x30d42);
  if (input == (uchar *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/test-reader.c"
                  ,0x11f,"int check_long_utf16(void)");
  }
  printf("checking a long utf16 sequence...\n");
  *input = 0xff;
  failed = 2;
  input[1] = 0xfe;
  for (iStack_1f0 = 0; iStack_1f0 < 100000; iStack_1f0 = iStack_1f0 + 1) {
    if (iStack_1f0 % 2 == 0) {
      input[failed] = '/';
      input[failed + 1] = '\x04';
    }
    else {
      input[failed] = '\x10';
      input[failed + 1] = '\x04';
    }
    failed = failed + 2;
  }
  yaml_parser_initialize((yaml_parser_t *)&j);
  yaml_parser_set_input_string((yaml_parser_t *)&j,input,0x30d42);
  failed = 0;
  do {
    if (99999 < failed) {
LAB_00102de2:
      if (buffer._4_4_ == 0) {
        iVar1 = yaml_parser_update_buffer((yaml_parser_t *)&j,1);
        if (iVar1 == 0) {
          printf("\treader error: %s at %ld\n",parser._0_8_,parser.problem);
          buffer._4_4_ = 1;
        }
        else if (*parser.buffer.end != '\0') {
          printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n",(ulong)*parser.buffer.end,
                 (ulong)(uint)parser.input._16_4_,parser.buffer.last);
          buffer._4_4_ = 1;
        }
      }
      yaml_parser_delete((yaml_parser_t *)&j);
      free(input);
      printf("checking a long utf16 sequence: %d fail(s)\n",(ulong)buffer._4_4_);
      return buffer._4_4_;
    }
    if ((parser.buffer.last == (yaml_char_t *)0x0) &&
       (iVar1 = yaml_parser_update_buffer((yaml_parser_t *)&j,1), iVar1 == 0)) {
      printf("\treader error: %s at %ld\n",parser._0_8_,parser.problem);
      buffer._4_4_ = 1;
      goto LAB_00102de2;
    }
    if (parser.buffer.last == (yaml_char_t *)0x0) {
      printf("\tnot enough characters at %d\n",(ulong)(uint)failed);
      buffer._4_4_ = 1;
      goto LAB_00102de2;
    }
    if (failed % 2 == 0) {
      buffer._2_1_ = 0xaf;
    }
    else {
      buffer._2_1_ = 0x90;
    }
    if ((*parser.buffer.end != 0xd0) || (parser.buffer.end[1] != buffer._2_1_)) {
      printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",(ulong)*parser.buffer.end,
             (ulong)parser.buffer.end[1],0xd0,(ulong)buffer._2_1_);
      buffer._4_4_ = 1;
      goto LAB_00102de2;
    }
    parser.buffer.end = parser.buffer.end + 2;
    parser.buffer.last = parser.buffer.last + -1;
    failed = failed + 1;
  } while( true );
}

Assistant:

int check_long_utf16(void)
{
    yaml_parser_t parser;
    int k = 0;
    int j;
    int failed = 0;
    unsigned char ch0, ch1;
    unsigned char *buffer = (unsigned char *)malloc(2+LONG*2);
    assert(buffer);
    printf("checking a long utf16 sequence...\n");
    buffer[k++] = '\xff';
    buffer[k++] = '\xfe';
    for (j = 0; j < LONG; j ++) {
        if (j % 2) {
            buffer[k++] = '\x10';
            buffer[k++] = '\x04';
        }
        else {
            buffer[k++] = '/';
            buffer[k++] = '\x04';
        }
    }
    yaml_parser_initialize(&parser);
    yaml_parser_set_input_string(&parser, buffer, 2+LONG*2);
    for (k = 0; k < LONG; k++) {
        if (!parser.unread) {
            if (!yaml_parser_update_buffer(&parser, 1)) {
                printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
                failed = 1;
                break;
            }
        }
        if (!parser.unread) {
            printf("\tnot enough characters at %d\n", k);
            failed = 1;
            break;
        }
        if (k % 2) {
            ch0 = '\xd0';
            ch1 = '\x90';
        }
        else {
            ch0 = '\xd0';
            ch1 = '\xaf';
        }
        if (parser.buffer.pointer[0] != ch0 || parser.buffer.pointer[1] != ch1) {
            printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",
                    (int)parser.buffer.pointer[0], (int)parser.buffer.pointer[1],
                    (int)ch0, (int)ch1);
            failed = 1;
            break;
        }
        parser.buffer.pointer += 2;
        parser.unread -= 1;
    }
    if (!failed) {
        if (!yaml_parser_update_buffer(&parser, 1)) {
            printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
            failed = 1;
        }
        else if (parser.buffer.pointer[0] != '\0') {
            printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n", (int)parser.buffer.pointer[0], parser.eof, (long)parser.unread);
            failed = 1;
        }
    }
    yaml_parser_delete(&parser);
    free(buffer);
    printf("checking a long utf16 sequence: %d fail(s)\n", failed);
    return failed;
}